

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

TestCaseGroup *
deqp::egl::createCaseGroup<deqp::egl::PreserveBackBufferCase>
          (EglTestContext *eglTestCtx,string *name,string *desc)

{
  TestCaseGroup *this;
  ResizeTest *this_00;
  long *plVar1;
  long lVar2;
  ResizeParams params [4];
  undefined1 local_178 [32];
  undefined1 *local_158;
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"shrink","");
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"Shrink in both dimensions","");
  local_138 = 0x80;
  uStack_134 = 0x80;
  uStack_130 = 0x20;
  uStack_12c = 0x20;
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"grow","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Grow in both dimensions","");
  local_e8 = 0x20;
  uStack_e4 = 0x20;
  uStack_e0 = 0x80;
  uStack_dc = 0x80;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"stretch_width","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Grow horizontally, shrink vertically","");
  local_98 = 0x20;
  uStack_94 = 0x80;
  uStack_90 = 0x80;
  uStack_8c = 0x20;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"stretch_height","");
  plVar1 = local_58;
  local_68[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Grow vertically, shrink horizontally","");
  local_48 = 0x2000000080;
  uStack_40 = 0x8000000020;
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,eglTestCtx,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p);
  lVar2 = 0;
  do {
    this_00 = (ResizeTest *)operator_new(0x1b48);
    ResizeTest::ResizeTest(this_00,eglTestCtx,(ResizeParams *)(local_178 + lVar2));
    (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ResizeTest_021568a8;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0x140);
  lVar2 = -0x140;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    if (plVar1 + -4 != (long *)plVar1[-6]) {
      operator_delete((long *)plVar1[-6],plVar1[-4] + 1);
    }
    plVar1 = plVar1 + -10;
    lVar2 = lVar2 + 0x50;
  } while (lVar2 != 0);
  return this;
}

Assistant:

TestCaseGroup* createCaseGroup(EglTestContext&	eglTestCtx,
							   const string&	name,
							   const string&	desc)
{
	const ResizeParams		params[]	=
	{
		{ "shrink",			"Shrink in both dimensions",
		  IVec2(128, 128),	IVec2(32, 32) },
		{ "grow",			"Grow in both dimensions",
		  IVec2(32, 32),	IVec2(128, 128) },
		{ "stretch_width",	"Grow horizontally, shrink vertically",
		  IVec2(32, 128),	IVec2(128, 32) },
		{ "stretch_height",	"Grow vertically, shrink horizontally",
		  IVec2(128, 32),	IVec2(32, 128) },
	};
	TestCaseGroup* const	group		=
		new TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str());

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(params); ++ndx)
		group->addChild(new Case(eglTestCtx, params[ndx]));

	return group;
}